

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

sockaddr_in Utils::get_sockaddr(char *name,int port)

{
  undefined2 uVar1;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  sockaddr *psVar2;
  undefined1 uVar13;
  sockaddr_in sVar14;
  uint16_t uVar15;
  invalid_argument *this;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [36];
  int local_64;
  undefined1 local_60 [4];
  int code;
  addrinfo hints;
  addrinfo *addr;
  int port_local;
  char *name_local;
  sockaddr_in sock_addr;
  undefined6 uVar4;
  undefined5 uVar6;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  
  hints.ai_next = (addrinfo *)0x0;
  memset(&name_local,0,0x10);
  if (name == (char *)0x0) {
    name_local._4_4_ = htonl(0);
  }
  else {
    prepare_hints((addrinfo *)local_60);
    local_64 = getaddrinfo(name,(char *)0x0,(addrinfo *)local_60,(addrinfo **)&hints.ai_next);
    if (local_64 != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"getaddrinfo: ",&local_a9);
      gai_strerror(local_64);
      std::operator+(local_88,(char *)local_a8);
      std::invalid_argument::invalid_argument(this,(string *)local_88);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    psVar2 = (hints.ai_next)->ai_addr;
    uVar1 = psVar2->sa_family;
    uVar3 = psVar2->sa_data[0];
    uVar5 = psVar2->sa_data[1];
    uVar7 = psVar2->sa_data[2];
    uVar9 = psVar2->sa_data[3];
    uVar11 = psVar2->sa_data[4];
    uVar13 = psVar2->sa_data[5];
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar6 = CONCAT41(uVar8,uVar5);
    uVar4 = CONCAT51(uVar6,uVar3);
    name_local._2_2_ = (undefined2)uVar4;
    sock_addr._0_8_ = *(undefined8 *)(psVar2->sa_data + 6);
    name_local._0_2_ = uVar1;
    name_local._4_4_ = uVar8;
    freeaddrinfo((addrinfo *)hints.ai_next);
  }
  name_local._0_2_ = 2;
  addr._4_2_ = (uint16_t)port;
  uVar15 = htons(addr._4_2_);
  sVar14.sin_port = uVar15;
  sVar14.sin_family = name_local._0_2_;
  sVar14.sin_addr.s_addr = name_local._4_4_;
  sVar14.sin_zero = (uchar  [8])sock_addr._0_8_;
  return sVar14;
}

Assistant:

struct sockaddr_in Utils::get_sockaddr(char* name, int port) {
    struct sockaddr_in sock_addr;
    struct addrinfo *addr = NULL;
    memset(&sock_addr, 0, sizeof(sock_addr));

    if (name != NULL) {
        struct addrinfo hints;
        prepare_hints(&hints);
        int code = getaddrinfo(name, NULL, &hints, &addr);
        if (code != 0) {
            throw std::invalid_argument(std::string("getaddrinfo: ") + gai_strerror(code));
        }
        memcpy(&sock_addr, addr->ai_addr, sizeof(struct sockaddr));
        freeaddrinfo(addr);
    } else {
        sock_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    }
    sock_addr.sin_family = AF_INET;
    sock_addr.sin_port = htons(port);

    return sock_addr;
}